

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev-primality-test.cpp
# Opt level: O2

polynomial * __thiscall
polynomial::operator*(polynomial *__return_storage_ptr__,polynomial *this,polynomial *other)

{
  uint64_t b;
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  int j;
  uint64_t uVar4;
  uint64_t r;
  
  r = (long)(this->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start >> 3;
  polynomial(__return_storage_ptr__,r,this->n);
  for (uVar2 = 0; uVar2 != r; uVar2 = uVar2 + 1) {
    for (uVar4 = 0; r != uVar4; uVar4 = uVar4 + 1) {
      uVar3 = (uVar2 + uVar4) % r;
      uVar1 = (__return_storage_ptr__->p).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      b = gaIMulMod((this->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar2],
                    (other->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar4],this->n);
      uVar1 = gaIAddMod(uVar1,b,this->n);
      (__return_storage_ptr__->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar3] = uVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

polynomial operator* (const polynomial& other) {
        uint64_t r = this->p.size();
        polynomial ret(r, n);
        for (int i = 0; i < r; i++) {
            for (int j = 0; j < r; j++) {
                 ret.p[(i+j) % r] = gaIAddMod(ret.p[(i+j) % r], gaIMulMod(this->p[i], other.p[j], this->n), this->n);
            }
        }
        return ret;
    }